

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigUtil.c
# Opt level: O3

int Fraig_CountNodes(Fraig_Man_t *pMan,int fEquiv)

{
  int iVar1;
  Fraig_NodeVec_t *p;
  
  p = Fraig_Dfs(pMan,fEquiv);
  iVar1 = p->nSize;
  Fraig_NodeVecFree(p);
  return iVar1;
}

Assistant:

int Fraig_CountNodes( Fraig_Man_t * pMan, int fEquiv )
{
    Fraig_NodeVec_t * vNodes;
    int RetValue;
    vNodes = Fraig_Dfs( pMan, fEquiv );
    RetValue = vNodes->nSize;
    Fraig_NodeVecFree( vNodes );
    return RetValue;
}